

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O3

void __thiscall
tchecker::algorithms::couvscc::
single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::merge_scc
          (single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t> *this
          ,node_sptr_t *n,stats_t *stats)

{
  uint uVar1;
  node_sptr_t nVar2;
  long lVar3;
  _Elt_pointer prVar4;
  uint *puVar5;
  bool *pbVar6;
  underflow_error *this_00;
  overflow_error *this_01;
  make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
  *pmVar7;
  code *pcVar8;
  undefined *puVar9;
  node_sptr_t local_48;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
  local_40;
  stats_t *local_38;
  
  local_48._t = (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
                 *)0x0;
  local_38 = stats;
  do {
    prVar4 = (this->_roots).c.
             super__Deque_base<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (prVar4 == (this->_roots).c.
                  super__Deque_base<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      prVar4 = (this->_roots).c.
               super__Deque_base<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    nVar2._t = local_48._t;
    if (&local_48 != &prVar4[-1].n) {
      nVar2._t = prVar4[-1].n._t;
      if (((node_t *)nVar2._t != (node_t *)0x0) &&
         (lVar3 = *(long *)&((node_t *)((long)nVar2._t + -0xc))->_dfsnum + 1,
         *(long *)&((node_t *)((long)nVar2._t + -0xc))->_dfsnum = lVar3, lVar3 == -2)) {
        this_00 = (underflow_error *)__cxa_allocate_exception(0x10);
        std::overflow_error::overflow_error((overflow_error *)this_00,"reference counter overflow");
        pcVar8 = std::overflow_error::~overflow_error;
        puVar9 = &std::overflow_error::typeinfo;
LAB_0012d988:
        __cxa_throw(this_00,puVar9,pcVar8);
      }
      if ((node_t *)local_48._t != (node_t *)0x0) {
        pmVar7 = (((edge_list_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>
                    *)((long)(local_48._t + -1) + 0x20))->_head)._t;
        if (pmVar7 == (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
                       *)0x0) {
          this_00 = (underflow_error *)__cxa_allocate_exception(0x10);
          std::underflow_error::underflow_error(this_00,"reference counter underflow");
          pcVar8 = std::underflow_error::~underflow_error;
          puVar9 = &std::underflow_error::typeinfo;
          goto LAB_0012d988;
        }
        (((edge_list_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>
           *)((long)(local_48._t + -1) + 0x20))->_head)._t =
             (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
              *)((long)&pmVar7[-1].
                        super_edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>
                        .
                        super_edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>
                        .
                        super_edge_node_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>
                        ._node._t + 7);
      }
    }
    local_48._t = nVar2._t;
    if ((node_t *)local_48._t == (node_t *)0x0) goto LAB_0012d913;
    if ((((local_48._t)->
         super_node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>
         ).super_node_t.super_node_t.super_node_flags_t._flags &
        ((local_48._t)->
        super_node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>
        ).super_node_t.super_node_t.super_node_flags_t.NODE_FINAL) != 0) {
      pbVar6 = stats_t::cycle(local_38);
      *pbVar6 = true;
      goto LAB_0012d8fc;
    }
    std::
    deque<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
    ::pop_back(&(this->_roots).c);
    if ((node_t *)local_48._t == (node_t *)0x0) {
LAB_0012d913:
      __assert_fail("_t != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                    ,0x1db,
                    "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t, tchecker::tck_liveness::zg_couvscc::edge_t>>>::operator->() const [T = tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t, tchecker::tck_liveness::zg_couvscc::edge_t>>]"
                   );
    }
    puVar5 = couvscc::node_t::dfsnum((node_t *)local_48._t);
    if ((node_t *)n->_t == (node_t *)0x0) goto LAB_0012d913;
    uVar1 = *puVar5;
    puVar5 = couvscc::node_t::dfsnum((node_t *)n->_t);
  } while (*puVar5 < uVar1);
  if (((node_t *)local_48._t != (node_t *)0x0) &&
     (pmVar7 = (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
                *)((long)&(((((edge_list_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>
                               *)((long)(local_48._t + -1) + 0x20))->_head)._t)->
                          super_edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>
                          ).super_edge_t.super_edge_vedge_t._vedge._t + 1),
     (((edge_list_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>
        *)((long)(local_48._t + -1) + 0x20))->_head)._t = pmVar7,
     pmVar7 == (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
                *)0xfffffffffffffffe)) {
    this_01 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_01,"reference counter overflow");
    __cxa_throw(this_01,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  local_40._t = local_48._t;
  std::
  deque<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,std::allocator<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>>
  ::
  emplace_back<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>
            ((deque<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,std::allocator<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>>
              *)&this->_roots,(roots_stack_entry_t *)&local_40);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_40);
LAB_0012d8fc:
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_48);
  return;
}

Assistant:

void merge_scc(node_sptr_t & n, tchecker::algorithms::couvscc::stats_t & stats)
  {
    node_sptr_t u{nullptr};
    do {
      u = _roots.top().n;
      if (u->final()) {
        stats.cycle() = true;
        return;
      }
      _roots.pop();
    } while (u->dfsnum() > n->dfsnum());
    _roots.push(roots_stack_entry_t{u});
  }